

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall TiXmlUnknown::Print(TiXmlUnknown *this,FILE *cfile,int depth)

{
  int iVar1;
  
  iVar1 = 0;
  if (0 < depth) {
    iVar1 = depth;
  }
  while (iVar1 != 0) {
    fwrite("    ",4,1,(FILE *)cfile);
    iVar1 = iVar1 + -1;
  }
  fprintf((FILE *)cfile,"<%s>",((this->super_TiXmlNode).value.rep_)->str);
  return;
}

Assistant:

void TiXmlUnknown::Print( FILE* cfile, int depth ) const
{
	for ( int i=0; i<depth; i++ )
		fprintf( cfile, "    " );
	fprintf( cfile, "<%s>", value.c_str() );
}